

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopIsAndType(char *pSop)

{
  int iVar1;
  char *local_20;
  char *pCur;
  char *pSop_local;
  
  iVar1 = Abc_SopGetCubeNum(pSop);
  local_20 = pSop;
  if (iVar1 == 1) {
    for (; *local_20 != ' '; local_20 = local_20 + 1) {
      if (*local_20 == '-') {
        return 0;
      }
    }
    if (local_20[1] == '1') {
      pSop_local._4_4_ = 1;
    }
    else {
      pSop_local._4_4_ = 0;
    }
  }
  else {
    pSop_local._4_4_ = 0;
  }
  return pSop_local._4_4_;
}

Assistant:

int Abc_SopIsAndType( char * pSop )
{
    char * pCur;
    if ( Abc_SopGetCubeNum(pSop) != 1 )
        return 0;
    for ( pCur = pSop; *pCur != ' '; pCur++ )
        if ( *pCur == '-' )
            return 0;
    if ( pCur[1] != '1' )
        return 0;
    return 1;
}